

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void RefineUsingDistortion
               (VP8EncIterator *it,int try_both_modes,int refine_uv_mode,VP8ModeScore *rd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  VP8EncIterator *pVVar4;
  uint8_t *yuv_out;
  uint16_t *puVar5;
  uint8_t *puVar6;
  long lVar7;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  VP8EncIterator *in_RDI;
  score_t score_2;
  uint8_t *ref_2;
  uint8_t *src_2;
  score_t best_uv_score;
  VP8ModeScore *in_stack_00000038;
  int best_mode_1;
  uint8_t *tmp_dst;
  score_t score_1;
  uint8_t *ref_1;
  uint16_t *mode_costs;
  uint8_t *src_1;
  score_t best_i4_score;
  int best_i4_mode;
  score_t score;
  uint8_t *ref;
  uint8_t *src;
  int best_mode;
  score_t bit_limit;
  score_t i4_bit_sum;
  score_t score_i4;
  int lambda_d_uv;
  int lambda_d_i4;
  int lambda_d_i16;
  VP8SegmentInfo *dqm;
  int is_i16;
  int mode;
  int nz;
  score_t best_score;
  int in_stack_0000016c;
  uint8_t *in_stack_00000170;
  VP8ModeScore *in_stack_00000178;
  VP8EncIterator *in_stack_00000180;
  VP8EncIterator *it_00;
  undefined3 in_stack_ffffffffffffff1c;
  VP8EncIterator *in_stack_ffffffffffffff20;
  long local_c8;
  int local_bc;
  uint8_t *puVar8;
  undefined4 in_stack_ffffffffffffff78;
  VP8EncIterator *in_stack_ffffffffffffff80;
  long local_58;
  VP8EncIterator *local_50;
  uint local_2c;
  int local_28;
  uint local_24;
  VP8EncIterator *local_20;
  int local_c;
  
  local_20 = (VP8EncIterator *)0x7fffffffffffff;
  local_24 = 0;
  uVar3 = CONCAT13(1,in_stack_ffffffffffffff1c);
  if (in_ESI == 0) {
    uVar3 = CONCAT13(((uint)*in_RDI->mb & 3) == 1,in_stack_ffffffffffffff1c);
  }
  local_2c = uVar3 >> 0x18;
  local_50 = (VP8EncIterator *)in_RDI->enc->dqm[*(byte *)in_RDI->mb >> 5 & 3].i4_penalty;
  local_58 = 0;
  if (in_ESI == 0) {
    pVVar4 = (VP8EncIterator *)0x7fffffffffffff;
  }
  else {
    pVVar4 = (VP8EncIterator *)(long)in_RDI->enc->mb_header_limit;
  }
  it_00 = pVVar4;
  local_c = in_ESI;
  if (local_2c != 0) {
    puVar8 = in_RDI->yuv_in;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      iVar1 = (*VP8SSE16x16)(puVar8,in_RDI->yuv_p + (int)(uint)VP8I16ModeOffsets[local_28]);
      in_stack_ffffffffffffff80 =
           (VP8EncIterator *)
           ((long)iVar1 * 0x100 + (long)(int)((uint)VP8FixedCostsI16[local_28] * 0x6a));
      if (((local_28 < 1) || ((long)(ulong)VP8FixedCostsI16[local_28] <= (long)pVVar4)) &&
         ((long)in_stack_ffffffffffffff80 < (long)local_20)) {
        local_20 = in_stack_ffffffffffffff80;
      }
    }
    if (((in_RDI->x == 0) || (in_RDI->y == 0)) && (iVar1 = IsFlatSource16(puVar8), iVar1 != 0)) {
      local_c = 0;
    }
    VP8SetIntra16Mode(in_stack_ffffffffffffff20,uVar3);
  }
  if ((local_c != 0) || (local_2c == 0)) {
    local_2c = 0;
    VP8IteratorStartI4(it_00);
    do {
      iVar1 = -1;
      puVar8 = (uint8_t *)0x7fffffffffffff;
      yuv_out = in_RDI->yuv_in + (int)(uint)VP8Scan[in_RDI->i4];
      puVar5 = GetCostModeI4(in_RDI,(uint8_t *)(in_RCX + 0x34c));
      MakeIntra4Preds((VP8EncIterator *)0x17eef5);
      for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
        iVar2 = (*VP8SSE4x4)(yuv_out,in_RDI->yuv_p + (int)(uint)VP8I4ModeOffsets[local_28]);
        puVar6 = (uint8_t *)(long)(int)(iVar2 * 0x100 + (uint)puVar5[local_28] * 0xb);
        if ((long)puVar6 < (long)puVar8) {
          puVar8 = puVar6;
          iVar1 = local_28;
        }
      }
      local_58 = (ulong)puVar5[iVar1] + local_58;
      *(char *)(in_RCX + 0x34c + (long)in_RDI->i4) = (char)iVar1;
      local_50 = (VP8EncIterator *)(puVar8 + (long)local_50);
      if (((long)local_20 <= (long)local_50) || ((long)pVVar4 < local_58)) {
        local_2c = 1;
        break;
      }
      iVar1 = ReconstructIntra4(in_stack_ffffffffffffff80,
                                (int16_t *)CONCAT44(iVar1,in_stack_ffffffffffffff78),puVar8,yuv_out,
                                (int)((ulong)puVar5 >> 0x20));
      local_24 = iVar1 << ((byte)in_RDI->i4 & 0x1f) | local_24;
      iVar1 = VP8IteratorRotateI4(in_RDI,in_RDI->yuv_out2);
    } while (iVar1 != 0);
  }
  if (local_2c == 0) {
    VP8SetIntra4Mode(in_RDI,(uint8_t *)(in_RCX + 0x34c));
    SwapOut((VP8EncIterator *)0x17f118);
    local_20 = local_50;
  }
  else {
    local_24 = ReconstructIntra16(in_stack_00000180,in_stack_00000178,in_stack_00000170,
                                  in_stack_0000016c);
  }
  if (in_EDX != 0) {
    local_bc = -1;
    local_c8 = 0x7fffffffffffff;
    puVar8 = in_RDI->yuv_in;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      iVar1 = (*VP8SSE16x8)(puVar8 + 0x10,in_RDI->yuv_p + (int)(uint)VP8UVModeOffsets[local_28]);
      lVar7 = (long)(int)(iVar1 * 0x100 + (uint)VP8FixedCostsUV[local_28] * 0x78);
      if (lVar7 < local_c8) {
        local_bc = local_28;
        local_c8 = lVar7;
      }
    }
    VP8SetIntraUVMode(in_RDI,local_bc);
  }
  uVar3 = ReconstructUV((VP8EncIterator *)tmp_dst,in_stack_00000038,(uint8_t *)best_uv_score,
                        src_2._4_4_);
  *(uint *)(in_RCX + 0x360) = uVar3 | local_24;
  *(VP8EncIterator **)(in_RCX + 0x20) = local_20;
  return;
}

Assistant:

static void RefineUsingDistortion(VP8EncIterator* WEBP_RESTRICT const it,
                                  int try_both_modes, int refine_uv_mode,
                                  VP8ModeScore* WEBP_RESTRICT const rd) {
  score_t best_score = MAX_COST;
  int nz = 0;
  int mode;
  int is_i16 = try_both_modes || (it->mb->type == 1);

  const VP8SegmentInfo* const dqm = &it->enc->dqm[it->mb->segment];
  // Some empiric constants, of approximate order of magnitude.
  const int lambda_d_i16 = 106;
  const int lambda_d_i4 = 11;
  const int lambda_d_uv = 120;
  score_t score_i4 = dqm->i4_penalty;
  score_t i4_bit_sum = 0;
  const score_t bit_limit = try_both_modes ? it->enc->mb_header_limit
                                           : MAX_COST;  // no early-out allowed

  if (is_i16) {   // First, evaluate Intra16 distortion
    int best_mode = -1;
    const uint8_t* const src = it->yuv_in + Y_OFF_ENC;
    for (mode = 0; mode < NUM_PRED_MODES; ++mode) {
      const uint8_t* const ref = it->yuv_p + VP8I16ModeOffsets[mode];
      const score_t score = (score_t)VP8SSE16x16(src, ref) * RD_DISTO_MULT
                          + VP8FixedCostsI16[mode] * lambda_d_i16;
      if (mode > 0 && VP8FixedCostsI16[mode] > bit_limit) {
        continue;
      }

      if (score < best_score) {
        best_mode = mode;
        best_score = score;
      }
    }
    if (it->x == 0 || it->y == 0) {
      // avoid starting a checkerboard resonance from the border. See bug #432.
      if (IsFlatSource16(src)) {
        best_mode = (it->x == 0) ? 0 : 2;
        try_both_modes = 0;  // stick to i16
      }
    }
    VP8SetIntra16Mode(it, best_mode);
    // we'll reconstruct later, if i16 mode actually gets selected
  }

  // Next, evaluate Intra4
  if (try_both_modes || !is_i16) {
    // We don't evaluate the rate here, but just account for it through a
    // constant penalty (i4 mode usually needs more bits compared to i16).
    is_i16 = 0;
    VP8IteratorStartI4(it);
    do {
      int best_i4_mode = -1;
      score_t best_i4_score = MAX_COST;
      const uint8_t* const src = it->yuv_in + Y_OFF_ENC + VP8Scan[it->i4];
      const uint16_t* const mode_costs = GetCostModeI4(it, rd->modes_i4);

      MakeIntra4Preds(it);
      for (mode = 0; mode < NUM_BMODES; ++mode) {
        const uint8_t* const ref = it->yuv_p + VP8I4ModeOffsets[mode];
        const score_t score = VP8SSE4x4(src, ref) * RD_DISTO_MULT
                            + mode_costs[mode] * lambda_d_i4;
        if (score < best_i4_score) {
          best_i4_mode = mode;
          best_i4_score = score;
        }
      }
      i4_bit_sum += mode_costs[best_i4_mode];
      rd->modes_i4[it->i4] = best_i4_mode;
      score_i4 += best_i4_score;
      if (score_i4 >= best_score || i4_bit_sum > bit_limit) {
        // Intra4 won't be better than Intra16. Bail out and pick Intra16.
        is_i16 = 1;
        break;
      } else {  // reconstruct partial block inside yuv_out2 buffer
        uint8_t* const tmp_dst = it->yuv_out2 + Y_OFF_ENC + VP8Scan[it->i4];
        nz |= ReconstructIntra4(it, rd->y_ac_levels[it->i4],
                                src, tmp_dst, best_i4_mode) << it->i4;
      }
    } while (VP8IteratorRotateI4(it, it->yuv_out2 + Y_OFF_ENC));
  }

  // Final reconstruction, depending on which mode is selected.
  if (!is_i16) {
    VP8SetIntra4Mode(it, rd->modes_i4);
    SwapOut(it);
    best_score = score_i4;
  } else {
    nz = ReconstructIntra16(it, rd, it->yuv_out + Y_OFF_ENC, it->preds[0]);
  }

  // ... and UV!
  if (refine_uv_mode) {
    int best_mode = -1;
    score_t best_uv_score = MAX_COST;
    const uint8_t* const src = it->yuv_in + U_OFF_ENC;
    for (mode = 0; mode < NUM_PRED_MODES; ++mode) {
      const uint8_t* const ref = it->yuv_p + VP8UVModeOffsets[mode];
      const score_t score = VP8SSE16x8(src, ref) * RD_DISTO_MULT
                          + VP8FixedCostsUV[mode] * lambda_d_uv;
      if (score < best_uv_score) {
        best_mode = mode;
        best_uv_score = score;
      }
    }
    VP8SetIntraUVMode(it, best_mode);
  }
  nz |= ReconstructUV(it, rd, it->yuv_out + U_OFF_ENC, it->mb->uv_mode);

  rd->nz = nz;
  rd->score = best_score;
}